

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::SmokeTest::prepareDstPxls
          (SmokeTest *this,testCase *test_case,GLubyte **out_pixels)

{
  GLenum internal_format_00;
  GLenum type_00;
  int iVar1;
  GLuint GVar2;
  uint uVar3;
  GLubyte *pGVar4;
  TestError *this_00;
  GLubyte *pixel_data;
  GLuint j;
  GLenum type;
  GLuint req_memory;
  GLuint pixel_size;
  GLuint n_pixels;
  GLuint n_layers;
  GLenum internal_format;
  GLubyte **out_pixels_local;
  testCase *test_case_local;
  SmokeTest *this_local;
  
  internal_format_00 = test_case->m_internal_format;
  iVar1 = 6;
  if (test_case->m_target != 0x9009) {
    iVar1 = 1;
  }
  GVar2 = Utils::getPixelSizeForFormat(internal_format_00);
  uVar3 = GVar2 * iVar1 * 0x100;
  type_00 = test_case->m_type;
  pGVar4 = (GLubyte *)operator_new__((ulong)uVar3);
  *out_pixels = pGVar4;
  if (*out_pixels == (GLubyte *)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Memory allocation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
               ,0x1014);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  memset(*out_pixels,0,(ulong)uVar3);
  for (pixel_data._0_4_ = 0; (uint)pixel_data < (uint)(iVar1 * 0x100);
      pixel_data._0_4_ = (uint)pixel_data + 1) {
    Utils::packPixel(internal_format_00,type_00,1.0,1.0,1.0,1.0,
                     *out_pixels + (uint)pixel_data * GVar2);
  }
  return;
}

Assistant:

void SmokeTest::prepareDstPxls(const SmokeTest::testCase& test_case, GLubyte*& out_pixels) const
{
	static const GLuint n_pixels_per_layer = m_width * m_height;

	const GLenum internal_format = test_case.m_internal_format;
	const GLuint n_layers		 = (GL_TEXTURE_CUBE_MAP_ARRAY != test_case.m_target) ? m_depth : 6;
	const GLuint n_pixels		 = n_pixels_per_layer * n_layers;
	const GLuint pixel_size		 = Utils::getPixelSizeForFormat(internal_format);
	const GLuint req_memory		 = pixel_size * n_pixels;
	const GLenum type			 = test_case.m_type;

	/* Prepare storage */
	out_pixels = new GLubyte[req_memory];

	if (0 == out_pixels)
	{
		TCU_FAIL("Memory allocation failed");
	}

	memset(out_pixels, 0, req_memory);

	/* Fill pixels */
	for (GLuint j = 0; j < n_pixels; ++j)
	{
		GLubyte* pixel_data = out_pixels + j * pixel_size;

		Utils::packPixel(internal_format, type, 1.0, 1.0, 1.0, 1.0, pixel_data);
	}
}